

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Matrix<float,3,1,0,3,1>,Eigen::internal::assign_op<float,float>>
               (Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *dst,
               Matrix<float,_3,_1,_0,_3,_1> *src,assign_op<float,_float> *func)

{
  undefined1 local_50 [8];
  ActualDstType actualDst;
  assign_op<float,_float> *func_local;
  Matrix<float,_3,_1,_0,_3,_1> *src_local;
  Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *dst_local;
  
  actualDst.m_matrix.super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
  .super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)func;
  Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::Transpose
            ((Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)local_50,
             dst);
  Assignment<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)local_50,src,
        (assign_op<float,_float> *)
        actualDst.m_matrix.
        super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride)
  ;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}